

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O1

void __thiscall DIS::AggregateStatePdu::unmarshal(AggregateStatePdu *this,DataStream *dataStream)

{
  unsigned_short *d;
  unsigned_short *d_00;
  unsigned_short *d_01;
  unsigned_short *d_02;
  pointer *ppAVar1;
  pointer *ppEVar2;
  uint *d_03;
  pointer pAVar3;
  pointer pAVar4;
  iterator __position;
  pointer pEVar5;
  pointer pEVar6;
  iterator __position_00;
  pointer pEVar7;
  pointer pEVar8;
  pointer pVVar9;
  pointer pVVar10;
  pointer pVVar11;
  ulong uVar12;
  pointer pAVar13;
  pointer pEVar14;
  pointer pEVar15;
  AggregateID x;
  VariableDatum local_60;
  
  EntityManagementFamilyPdu::unmarshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_aggregateID,dataStream);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_aggregateState);
  EntityType::unmarshal(&this->_aggregateType,dataStream);
  DataStream::operator>>(dataStream,&this->_formation);
  AggregateMarking::unmarshal(&this->_aggregateMarking,dataStream);
  Vector3Float::unmarshal(&this->_dimensions,dataStream);
  Orientation::unmarshal(&this->_orientation,dataStream);
  Vector3Double::unmarshal(&this->_centerOfMass,dataStream);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  d = &this->_numberOfDisAggregates;
  DataStream::operator>>(dataStream,d);
  d_00 = &this->_numberOfDisEntities;
  DataStream::operator>>(dataStream,d_00);
  d_01 = &this->_numberOfSilentAggregateTypes;
  DataStream::operator>>(dataStream,d_01);
  d_02 = &this->_numberOfSilentEntityTypes;
  DataStream::operator>>(dataStream,d_02);
  pAVar3 = (this->_aggregateIDList).
           super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar4 = (this->_aggregateIDList).
           super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar13 = pAVar3;
  if (pAVar4 != pAVar3) {
    do {
      (**pAVar13->_vptr_AggregateID)(pAVar13);
      pAVar13 = pAVar13 + 1;
    } while (pAVar13 != pAVar4);
    (this->_aggregateIDList).super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar3;
  }
  if (*d != 0) {
    uVar12 = 0;
    do {
      AggregateID::AggregateID((AggregateID *)&local_60);
      AggregateID::unmarshal((AggregateID *)&local_60,dataStream);
      __position._M_current =
           (this->_aggregateIDList).
           super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_aggregateIDList).
          super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::AggregateID,std::allocator<DIS::AggregateID>>::
        _M_realloc_insert<DIS::AggregateID_const&>
                  ((vector<DIS::AggregateID,std::allocator<DIS::AggregateID>> *)
                   &this->_aggregateIDList,__position,(AggregateID *)&local_60);
      }
      else {
        (__position._M_current)->_vptr_AggregateID = (_func_int **)&PTR__AggregateID_0019f338;
        (__position._M_current)->_site = (undefined2)local_60._variableDatumID;
        (__position._M_current)->_application = local_60._variableDatumID._2_2_;
        (__position._M_current)->_aggregateID = (unsigned_short)local_60._variableDatumLength;
        ppAVar1 = &(this->_aggregateIDList).
                   super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      AggregateID::~AggregateID((AggregateID *)&local_60);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *d);
  }
  pEVar5 = (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pEVar14 = pEVar5;
  if (pEVar6 != pEVar5) {
    do {
      (**pEVar14->_vptr_EntityID)(pEVar14);
      pEVar14 = pEVar14 + 1;
    } while (pEVar14 != pEVar6);
    (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar5;
  }
  if (*d_00 != 0) {
    uVar12 = 0;
    do {
      EntityID::EntityID((EntityID *)&local_60);
      EntityID::unmarshal((EntityID *)&local_60,dataStream);
      __position_00._M_current =
           (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::EntityID,std::allocator<DIS::EntityID>>::
        _M_realloc_insert<DIS::EntityID_const&>
                  ((vector<DIS::EntityID,std::allocator<DIS::EntityID>> *)&this->_entityIDList,
                   __position_00,(EntityID *)&local_60);
      }
      else {
        (__position_00._M_current)->_vptr_EntityID = (_func_int **)&PTR__EntityID_0019fcb8;
        (__position_00._M_current)->_site = (undefined2)local_60._variableDatumID;
        (__position_00._M_current)->_application = local_60._variableDatumID._2_2_;
        (__position_00._M_current)->_entity = (unsigned_short)local_60._variableDatumLength;
        ppEVar2 = &(this->_entityIDList).
                   super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppEVar2 = *ppEVar2 + 1;
      }
      EntityID::~EntityID((EntityID *)&local_60);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *d_00);
  }
  DataStream::operator>>(dataStream,&this->_pad2);
  pEVar7 = (this->_silentAggregateSystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar8 = (this->_silentAggregateSystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar15 = pEVar7;
  if (pEVar8 != pEVar7) {
    do {
      (**pEVar15->_vptr_EntityType)(pEVar15);
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar8);
    (this->_silentAggregateSystemList).
    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar7;
  }
  if (*d_01 != 0) {
    uVar12 = 0;
    do {
      EntityType::EntityType((EntityType *)&local_60);
      EntityType::unmarshal((EntityType *)&local_60,dataStream);
      std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
                (&this->_silentAggregateSystemList,(value_type *)&local_60);
      EntityType::~EntityType((EntityType *)&local_60);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *d_01);
  }
  pEVar7 = (this->_silentEntitySystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar8 = (this->_silentEntitySystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar15 = pEVar7;
  if (pEVar8 != pEVar7) {
    do {
      (**pEVar15->_vptr_EntityType)(pEVar15);
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar8);
    (this->_silentEntitySystemList).
    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar7;
  }
  if (*d_02 != 0) {
    uVar12 = 0;
    do {
      EntityType::EntityType((EntityType *)&local_60);
      EntityType::unmarshal((EntityType *)&local_60,dataStream);
      std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
                (&this->_silentEntitySystemList,(value_type *)&local_60);
      EntityType::~EntityType((EntityType *)&local_60);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *d_02);
  }
  d_03 = &this->_numberOfVariableDatumRecords;
  DataStream::operator>>(dataStream,d_03);
  pVVar9 = (this->_variableDatumList).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar10 = (this->_variableDatumList).
            super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pVVar11 = pVVar9;
  if (pVVar10 != pVVar9) {
    do {
      (**pVVar11->_vptr_VariableDatum)(pVVar11);
      pVVar11 = pVVar11 + 1;
    } while (pVVar11 != pVVar10);
    (this->_variableDatumList).
    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar9;
  }
  if (*d_03 != 0) {
    uVar12 = 0;
    do {
      VariableDatum::VariableDatum(&local_60);
      VariableDatum::unmarshal(&local_60,dataStream);
      std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
                (&this->_variableDatumList,&local_60);
      VariableDatum::~VariableDatum(&local_60);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *d_03);
  }
  return;
}

Assistant:

void AggregateStatePdu::unmarshal(DataStream& dataStream)
{
    EntityManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _aggregateID.unmarshal(dataStream);
    dataStream >> _forceID;
    dataStream >> _aggregateState;
    _aggregateType.unmarshal(dataStream);
    dataStream >> _formation;
    _aggregateMarking.unmarshal(dataStream);
    _dimensions.unmarshal(dataStream);
    _orientation.unmarshal(dataStream);
    _centerOfMass.unmarshal(dataStream);
    _velocity.unmarshal(dataStream);
    dataStream >> _numberOfDisAggregates;
    dataStream >> _numberOfDisEntities;
    dataStream >> _numberOfSilentAggregateTypes;
    dataStream >> _numberOfSilentEntityTypes;

     _aggregateIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisAggregates; idx++)
     {
        AggregateID x;
        x.unmarshal(dataStream);
        _aggregateIDList.push_back(x);
     }

     _entityIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisEntities; idx++)
     {
        EntityID x;
        x.unmarshal(dataStream);
        _entityIDList.push_back(x);
     }
    dataStream >> _pad2;

     _silentAggregateSystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentAggregateTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentAggregateSystemList.push_back(x);
     }

     _silentEntitySystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentEntityTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentEntitySystemList.push_back(x);
     }
    dataStream >> _numberOfVariableDatumRecords;

     _variableDatumList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatumList.push_back(x);
     }
}